

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O3

StmNode * __thiscall Translator::visit(Translator *this,PrintNode *printNode)

{
  int iVar1;
  ExpList *this_00;
  undefined4 extraout_var;
  EXP *this_01;
  CALL *this_02;
  NAME *this_03;
  Label *this_04;
  ExpList *args;
  
  args = (ExpList *)0x0;
  while (printNode = (PrintNode *)((ExpListNode *)printNode)->next,
        (ExpListNode *)printNode != (ExpListNode *)0x0) {
    this_00 = (ExpList *)operator_new(0x20);
    iVar1 = (*(((ExpListNode *)printNode)->exp->super_StmtNode).super_ASTNode._vptr_ASTNode[4])
                      (((ExpListNode *)printNode)->exp,this);
    ExpList::ExpList(this_00,(ExprNode *)CONCAT44(extraout_var,iVar1),args);
    args = this_00;
  }
  this_01 = (EXP *)operator_new(0x18);
  this_02 = (CALL *)operator_new(0x20);
  this_03 = (NAME *)operator_new(0x18);
  this_04 = (Label *)operator_new(0x10);
  Label::Label(this_04,"printNode");
  NAME::NAME(this_03,this_04);
  CALL::CALL(this_02,(ExprNode *)this_03,args);
  EXP::EXP(this_01,(ExprNode *)this_02);
  return &this_01->super_StmNode;
}

Assistant:

StmNode *Translator::visit(PrintNode *printNode) {
    // pego a lista de expressoes do print
    ExpListNode *param = printNode->getExpList();
    // crio uma lista de expressoes da ICT
    ExpList *lcall = NULL;
    while (param) {
        //construo esse novo no com as expressoes do no
        lcall = new ExpList(param->getExp()->accept(this), lcall);
        param = param->getNext();
    }
    // retorno  uma expressao call com a lista de expressoes e o name/label criado
    return new EXP(new CALL(new NAME(new Label("printNode")), lcall));
}